

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int flatcc_verify_struct_as_root_with_size
              (void *buf,size_t bufsiz,char *fid,size_t size,uint16_t align)

{
  int iVar1;
  flatbuffers_uoffset_t end;
  flatbuffers_uoffset_t offset;
  uint16_t align_local;
  size_t size_local;
  char *fid_local;
  size_t bufsiz_local;
  void *buf_local;
  
  fid_local = (char *)bufsiz;
  bufsiz_local = (size_t)buf;
  iVar1 = flatcc_verify_buffer_header_with_size(buf,(size_t *)&fid_local,fid);
  if (iVar1 == 0) {
    end = (flatbuffers_uoffset_t)fid_local;
    offset = read_uoffset((void *)bufsiz_local,0);
    buf_local._4_4_ = verify_struct(end,0,offset,(flatbuffers_uoffset_t)size,align);
  }
  else {
    buf_local._4_4_ =
         flatcc_verify_buffer_header_with_size((void *)bufsiz_local,(size_t *)&fid_local,fid);
  }
  return buf_local._4_4_;
}

Assistant:

int flatcc_verify_struct_as_root_with_size(const void *buf, size_t bufsiz, const char *fid, size_t size, uint16_t align)
{
    check_result(flatcc_verify_buffer_header_with_size(buf, &bufsiz, fid));
    return verify_struct((uoffset_t)bufsiz, 0, read_uoffset(buf, 0), (uoffset_t)size, align);
}